

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O3

string_t __thiscall
duckdb::SubstringUnicode(duckdb *this,Vector *result,string_t input,int64_t offset,int64_t length)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong offset_00;
  long lVar5;
  long lVar6;
  uint uVar7;
  char *input_data;
  ulong input_size;
  anon_union_16_2_67f50693_for_value aVar8;
  undefined8 local_40;
  char *local_38;
  
  lVar6 = input.value._8_8_;
  local_38 = input.value._0_8_;
  uVar7 = (uint)result;
  input_data = (char *)((long)&local_40 + 4);
  if (0xc < uVar7) {
    input_data = local_38;
  }
  input_size = (ulong)result & 0xffffffff;
  local_40 = result;
  AssertInSupportedRange(input_size,lVar6,offset);
  if (offset != 0) {
    if (lVar6 < 0) {
      lVar6 = 1 - lVar6;
      lVar2 = lVar6 - offset;
      if (offset < 0) {
        lVar2 = lVar6;
        lVar6 = lVar6 - offset;
      }
      uVar4 = 0xffffffffffffffff;
      if (lVar2 < 1) {
        uVar4 = input_size;
      }
      offset_00 = input_size;
      if (uVar7 != 0) {
        lVar5 = 0;
        do {
          lVar5 = lVar5 + 1;
          if (lVar5 == lVar6) goto LAB_014c647c;
          if (lVar5 == lVar2) {
            uVar4 = offset_00;
          }
          offset_00 = offset_00 - 1;
        } while (offset_00 != 0);
        offset_00 = 0;
      }
LAB_014c647c:
      if ((uVar4 < input_size) || (uVar4 != 0xffffffffffffffff)) {
LAB_014c6505:
        aVar8.pointer =
             (anon_struct_16_3_d7536bce_for_pointer)
             SubstringSlice((Vector *)this,input_data,offset_00,uVar4 - offset_00);
        return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar8.pointer
        ;
      }
    }
    else {
      lVar6 = lVar6 + -1;
      if (offset < 0) {
        lVar2 = 0;
        if (0 < offset + lVar6) {
          lVar2 = offset + lVar6;
        }
      }
      else {
        lVar2 = 0;
        if (0 < lVar6) {
          lVar2 = lVar6;
        }
        lVar6 = lVar6 + offset;
      }
      if (uVar7 != 0) {
        offset_00 = 0xffffffffffffffff;
        uVar3 = 0;
        lVar5 = 0;
        do {
          uVar1 = uVar3;
          if ((lVar5 != lVar2) && (uVar4 = uVar3, uVar1 = offset_00, lVar5 == lVar6)) break;
          offset_00 = uVar1;
          lVar5 = lVar5 + 1;
          uVar3 = uVar3 + 1;
          uVar4 = input_size;
        } while (input_size != uVar3);
        if ((offset_00 != 0xffffffffffffffff) && (lVar2 < lVar6)) goto LAB_014c6505;
      }
    }
  }
  aVar8.pointer = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)this);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar8.pointer;
}

Assistant:

string_t SubstringUnicode(Vector &result, string_t input, int64_t offset, int64_t length) {
	auto input_data = input.GetData();
	auto input_size = input.GetSize();

	AssertInSupportedRange(input_size, offset, length);

	if (length == 0) {
		return SubstringEmptyString(result);
	}
	// first figure out which direction we need to scan
	idx_t start_pos;
	idx_t end_pos;
	if (offset < 0) {
		start_pos = 0;
		end_pos = DConstants::INVALID_INDEX;

		// negative offset: scan backwards
		int64_t start, end;

		// we express start and end as unicode codepoints from the back
		offset--;
		if (length < 0) {
			// negative length
			start = -offset - length;
			end = -offset;
		} else {
			// positive length
			start = -offset;
			end = -offset - length;
		}
		if (end <= 0) {
			end_pos = input_size;
		}
		int64_t current_character = 0;
		for (idx_t i = input_size; i > 0; i--) {
			if (IsCharacter(input_data[i - 1])) {
				current_character++;
				if (current_character == start) {
					start_pos = i;
					break;
				} else if (current_character == end) {
					end_pos = i;
				}
			}
		}
		while (!IsCharacter(input_data[start_pos])) {
			start_pos++;
		}
		while (end_pos < input_size && !IsCharacter(input_data[end_pos])) {
			end_pos++;
		}

		if (end_pos == DConstants::INVALID_INDEX) {
			return SubstringEmptyString(result);
		}
	} else {
		start_pos = DConstants::INVALID_INDEX;
		end_pos = input_size;

		// positive offset: scan forwards
		int64_t start, end;

		// we express start and end as unicode codepoints from the front
		offset--;
		if (length < 0) {
			// negative length
			start = MaxValue<int64_t>(0, offset + length);
			end = offset;
		} else {
			// positive length
			start = MaxValue<int64_t>(0, offset);
			end = offset + length;
		}

		int64_t current_character = 0;
		for (idx_t i = 0; i < input_size; i++) {
			if (IsCharacter(input_data[i])) {
				if (current_character == start) {
					start_pos = i;
				} else if (current_character == end) {
					end_pos = i;
					break;
				}
				current_character++;
			}
		}
		if (start_pos == DConstants::INVALID_INDEX || end == 0 || end <= start) {
			return SubstringEmptyString(result);
		}
	}
	D_ASSERT(end_pos >= start_pos);
	// after we have found these, we can slice the substring
	return SubstringSlice(result, input_data, UnsafeNumericCast<int64_t>(start_pos),
	                      UnsafeNumericCast<int64_t>(end_pos - start_pos));
}